

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O2

void eye_scale(double *mat,int N,double lambda)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  double *pdVar4;
  
  uVar1 = 0;
  uVar2 = 0;
  if (0 < N) {
    uVar2 = (ulong)(uint)N;
  }
  pdVar4 = mat;
  for (; uVar1 != uVar2; uVar1 = uVar1 + 1) {
    for (uVar3 = 0; (uint)N != uVar3; uVar3 = uVar3 + 1) {
      if (uVar1 == uVar3) {
        mat[uVar1 + uVar1 * (long)N] = lambda;
      }
      else {
        pdVar4[uVar3] = 0.0;
      }
    }
    pdVar4 = pdVar4 + N;
  }
  return;
}

Assistant:

void eye_scale(double *mat, int N, double lambda) {
	int i, j, t;
	for (i = 0; i < N; ++i) {
		for (j = 0; j < N; ++j) {
			t = i*N;
			if (i == j) {
				mat[t + j] = lambda;
			}
			else {
				mat[t + j] = 0.;
			}
		}

	}
}